

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Name __thiscall wasm::WasmBinaryBuilder::getDataName(WasmBinaryBuilder *this,Index index)

{
  size_type sVar1;
  reference this_00;
  pointer pDVar2;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  WasmBinaryBuilder *pWStack_20;
  Index index_local;
  WasmBinaryBuilder *this_local;
  
  local_24 = index;
  pWStack_20 = this;
  sVar1 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::size(&this->wasm->dataSegments);
  if (sVar1 <= index) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"invalid data segment index",&local_49);
    throwError(this,&local_48);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::operator[](&this->wasm->dataSegments,(ulong)local_24);
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (this_00);
  return (IString)(IString)(pDVar2->super_Named).name.super_IString.str;
}

Assistant:

Name WasmBinaryBuilder::getDataName(Index index) {
  if (index >= wasm.dataSegments.size()) {
    throwError("invalid data segment index");
  }
  return wasm.dataSegments[index]->name;
}